

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Parser * Catch::makeCommandLineParser(Parser *__return_storage_ptr__,ConfigData *config)

{
  Parser *__return_storage_ptr___00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer p_Var2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long in_FS_OFFSET;
  allocator local_2792;
  allocator local_2791;
  allocator local_2790;
  allocator local_278f;
  allocator local_278e;
  allocator local_278d;
  allocator local_278c;
  allocator local_278b;
  allocator local_278a;
  allocator local_2789;
  allocator local_2788;
  allocator local_2787;
  allocator local_2786;
  allocator local_2785;
  allocator local_2784;
  allocator local_2783;
  allocator local_2782;
  allocator local_2781;
  allocator local_2780;
  allocator local_277f;
  allocator local_277e;
  allocator local_277d;
  allocator local_277c;
  allocator local_277b;
  allocator local_277a;
  allocator local_2779;
  allocator local_2778;
  allocator local_2777;
  allocator local_2776;
  allocator local_2775;
  allocator local_2774;
  allocator local_2773;
  allocator local_2772;
  allocator local_2771;
  allocator local_2770;
  allocator local_276f;
  allocator local_276e;
  allocator local_276d;
  allocator local_276c;
  allocator local_276b;
  allocator local_276a;
  allocator local_2769;
  allocator local_2768;
  allocator local_2767;
  allocator local_2766;
  allocator local_2765;
  allocator local_2764;
  allocator local_2763;
  allocator local_2762;
  allocator local_2761;
  allocator local_2760;
  allocator local_275f;
  allocator local_275e;
  allocator local_275d;
  allocator local_275c;
  allocator local_275b;
  allocator local_275a;
  allocator local_2759;
  allocator local_2758;
  allocator local_2757;
  allocator local_2756;
  allocator local_2755;
  allocator local_2754;
  allocator local_2753;
  allocator local_2752;
  allocator local_2751;
  allocator local_2750;
  allocator local_274f;
  allocator local_274e;
  allocator local_274d;
  allocator local_274c;
  allocator local_274b;
  allocator local_274a;
  allocator local_2749;
  allocator local_2748;
  allocator local_2747;
  allocator local_2746;
  allocator local_2745;
  allocator local_2744;
  allocator local_2743;
  allocator local_2742;
  allocator local_2741;
  allocator local_2740;
  allocator local_273f;
  allocator local_273e;
  allocator local_273d;
  allocator local_273c;
  allocator local_273b;
  allocator local_273a;
  allocator local_2739;
  allocator local_2738;
  allocator local_2737;
  allocator local_2736;
  allocator local_2735;
  allocator local_2734;
  allocator local_2733;
  allocator local_2732;
  allocator local_2731;
  Parser *local_2730;
  ExeName local_2728;
  Parser local_2700;
  Parser local_26a0;
  Parser local_2640;
  Parser local_25e0;
  Parser local_2580;
  Parser local_2520;
  Parser local_24c0;
  Parser local_2460;
  Parser local_2400;
  Parser local_23a0;
  Parser local_2340;
  Parser local_22e0;
  Parser local_2280;
  Parser local_2220;
  Parser local_21c0;
  Parser local_2160;
  Parser local_2100;
  Parser local_20a0;
  Parser local_2040;
  Parser local_1fe0;
  Parser local_1f80;
  Parser local_1f20;
  Parser local_1ec0;
  Parser local_1e60;
  Parser local_1e00;
  Parser local_1da0;
  Parser local_1d40;
  Parser local_1ce0;
  Parser local_1c80;
  Parser local_1c20;
  Parser local_1bc0;
  string local_1b60 [32];
  string local_1b40;
  undefined1 local_1b20 [96];
  string local_1ac0 [32];
  value_type local_1aa0;
  string local_1a80;
  undefined1 local_1a60 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a00;
  string local_19e8 [32];
  value_type local_19c8;
  undefined1 local_19a8 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1948;
  string local_1930 [32];
  value_type local_1910;
  string local_18f0;
  __allocator_type __a2_10;
  string local_1890 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1870;
  string local_1858 [32];
  value_type local_1838;
  string local_1818;
  undefined1 local_17f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_17f0 [7];
  string local_17b8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1798;
  string local_1780 [32];
  value_type local_1760;
  string local_1740;
  __allocator_type __a2_9;
  string local_16e0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_16c0;
  string local_16a8 [32];
  value_type local_1688;
  string local_1668 [32];
  __allocator_type __a2_8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1640;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1638;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1630;
  string local_1628 [32];
  _Alloc_hider local_1608;
  size_type local_1600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_15f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_15e8;
  string local_15d0 [32];
  value_type local_15b0;
  __allocator_type __a2_7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1588 [7];
  string local_1550 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1530;
  string local_1518 [32];
  value_type local_14f8;
  string local_14d8 [32];
  undefined1 local_14b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_14b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_14a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_14a0;
  string local_1498 [32];
  _Alloc_hider local_1478;
  size_type local_1470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1468;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1458;
  string local_1440 [32];
  value_type local_1420;
  string local_1400 [32];
  undefined1 local_13e0 [8];
  pointer local_13d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_13d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_13c8;
  string local_13c0 [32];
  _Alloc_hider local_13a0;
  size_type local_1398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1380;
  string local_1368 [32];
  value_type local_1348;
  string local_1328 [32];
  __allocator_type __a2_6;
  string local_12e8 [32];
  _Alloc_hider local_12c8;
  size_type local_12c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_12a8;
  string local_1290 [32];
  value_type local_1270;
  undefined1 local_1250 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1248 [7];
  string local_1210 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11f0;
  string local_11d8 [32];
  value_type local_11b8;
  undefined1 local_1198 [64];
  string local_1158 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1138;
  string local_1120 [32];
  value_type local_1100;
  value_type local_10e0;
  string local_10c0 [32];
  __allocator_type __a2_5;
  string local_1080 [32];
  _Alloc_hider local_1060;
  size_type local_1058;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1050;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1040;
  string local_1028 [32];
  value_type local_1008;
  value_type local_fe8;
  string local_fc8;
  undefined1 local_fa8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_fa0 [7];
  string local_f68 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f48;
  string local_f30 [32];
  value_type local_f10;
  value_type local_ef0;
  __allocator_type __a2_4;
  string local_e90 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e70;
  string local_e58 [32];
  value_type local_e38;
  value_type local_e18;
  string local_df8 [32];
  __allocator_type __a2_3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_dd0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_dc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_dc0;
  string local_db8 [32];
  _Alloc_hider local_d98;
  size_type local_d90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d78;
  string local_d60 [32];
  value_type local_d40;
  value_type local_d20;
  string local_d00;
  __allocator_type __a2_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_cd8 [7];
  string local_ca0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c80;
  string local_c68 [32];
  value_type local_c48;
  value_type local_c28;
  string local_c08 [32];
  __allocator_type __a2_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_be0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_bd8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_bd0;
  string local_bc8 [32];
  _Alloc_hider local_ba8;
  size_type local_ba0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b88;
  string local_b70 [32];
  value_type local_b50;
  value_type local_b30;
  string local_b10 [32];
  undefined1 local_af0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_ae8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_ae0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ad8;
  string local_ad0 [32];
  _Alloc_hider local_ab0;
  size_type local_aa8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_aa0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a90;
  string local_a78 [32];
  value_type local_a58;
  value_type local_a38;
  string local_a18 [32];
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_9e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9e0;
  string local_9d8 [32];
  _Alloc_hider local_9b8;
  size_type local_9b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_998;
  string local_980 [32];
  value_type local_960;
  value_type local_940;
  undefined1 local_920 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_918 [7];
  string local_8e0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8c0;
  string local_8a8 [32];
  value_type local_888;
  value_type local_868;
  string local_848;
  undefined1 local_828 [64];
  string local_7e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7c8;
  string local_7b0 [32];
  value_type local_790;
  value_type local_770;
  string local_750 [32];
  undefined1 local_730 [64];
  _Alloc_hider local_6f0;
  size_type local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6d0;
  string local_6b8 [32];
  value_type local_698;
  value_type local_678;
  string local_658;
  undefined1 local_638 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d8;
  string local_5c0 [32];
  value_type local_5a0;
  value_type local_580;
  undefined1 local_560 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_500;
  string local_4e8 [32];
  value_type local_4c8;
  value_type local_4a8;
  undefined1 local_488 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_428;
  string local_410 [32];
  value_type local_3f0;
  value_type local_3d0;
  undefined1 local_3b0 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_350;
  string local_338 [32];
  value_type local_318;
  value_type local_2f8;
  undefined1 local_2d8 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  string local_260 [32];
  value_type local_240;
  value_type local_220;
  undefined1 local_200 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  string local_188 [32];
  value_type local_168;
  value_type local_148;
  undefined1 local_128 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  Opt local_b0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  clara::detail::ExeName::ExeName(&local_2728,&config->processName);
  clara::detail::Help::Help((Help *)&local_b0,&config->showHelp);
  clara::detail::ComposableParserImpl<Catch::clara::detail::ExeName>::operator|
            (&local_2700,&local_2728.super_ComposableParserImpl<Catch::clara::detail::ExeName>,
             (Help *)&local_b0);
  clara::detail::Opt::Opt((Opt *)local_128,&config->listTests);
  std::__cxx11::string::string((string *)&local_148,"-l",&local_2731);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,&local_148);
  std::__cxx11::string::string((string *)&local_168,"--list-tests",&local_2732);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c8,&local_168);
  std::__cxx11::string::string(local_188,"list all/matching test cases",&local_2733);
  std::__cxx11::string::_M_assign((string *)(local_128 + 0x40));
  clara::detail::Parser::operator|(&local_26a0,&local_2700,(Opt *)local_128);
  clara::detail::Opt::Opt((Opt *)local_200,&config->listTags);
  std::__cxx11::string::string((string *)&local_220,"-t",&local_2734);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a0,&local_220);
  std::__cxx11::string::string((string *)&local_240,"--list-tags",&local_2735);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a0,&local_240);
  std::__cxx11::string::string(local_260,"list all/matching tags",&local_2736);
  std::__cxx11::string::_M_assign((string *)(local_200 + 0x40));
  clara::detail::Parser::operator|(&local_2640,&local_26a0,(Opt *)local_200);
  clara::detail::Opt::Opt((Opt *)local_2d8,&config->showSuccessfulTests);
  std::__cxx11::string::string((string *)&local_2f8,"-s",&local_2737);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_278,&local_2f8);
  std::__cxx11::string::string((string *)&local_318,"--success",&local_2738);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_278,&local_318);
  std::__cxx11::string::string(local_338,"include successful tests in output",&local_2739);
  std::__cxx11::string::_M_assign((string *)(local_2d8 + 0x40));
  clara::detail::Parser::operator|(&local_25e0,&local_2640,(Opt *)local_2d8);
  clara::detail::Opt::Opt((Opt *)local_3b0,&config->shouldDebugBreak);
  std::__cxx11::string::string((string *)&local_3d0,"-b",&local_273a);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_350,&local_3d0);
  std::__cxx11::string::string((string *)&local_3f0,"--break",&local_273b);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_350,&local_3f0);
  std::__cxx11::string::string(local_410,"break into debugger on failure",&local_273c);
  std::__cxx11::string::_M_assign((string *)(local_3b0 + 0x40));
  clara::detail::Parser::operator|(&local_2580,&local_25e0,(Opt *)local_3b0);
  clara::detail::Opt::Opt((Opt *)local_488,&config->noThrow);
  std::__cxx11::string::string((string *)&local_4a8,"-e",&local_273d);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_428,&local_4a8);
  std::__cxx11::string::string((string *)&local_4c8,"--nothrow",&local_273e);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_428,&local_4c8);
  std::__cxx11::string::string(local_4e8,"skip exception tests",&local_273f);
  std::__cxx11::string::_M_assign((string *)(local_488 + 0x40));
  clara::detail::Parser::operator|(&local_2520,&local_2580,(Opt *)local_488);
  clara::detail::Opt::Opt((Opt *)local_560,&config->showInvisibles);
  std::__cxx11::string::string((string *)&local_580,"-i",&local_2740);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_500,&local_580);
  std::__cxx11::string::string((string *)&local_5a0,"--invisibles",&local_2741);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_500,&local_5a0);
  std::__cxx11::string::string(local_5c0,"show invisibles (tabs, newlines)",&local_2742);
  std::__cxx11::string::_M_assign((string *)(local_560 + 0x40));
  clara::detail::Parser::operator|(&local_24c0,&local_2520,(Opt *)local_560);
  std::__cxx11::string::string((string *)&local_658,"filename",&local_2743);
  clara::detail::Opt::Opt<std::__cxx11::string>((Opt *)local_638,&config->outputFilename,&local_658)
  ;
  std::__cxx11::string::string((string *)&local_678,"-o",&local_2744);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_5d8,&local_678);
  std::__cxx11::string::string((string *)&local_698,"--out",&local_2745);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_5d8,&local_698);
  std::__cxx11::string::string(local_6b8,"output filename",&local_2746);
  std::__cxx11::string::_M_assign((string *)(local_638 + 0x40));
  clara::detail::Parser::operator|(&local_2460,&local_24c0,(Opt *)local_638);
  std::__cxx11::string::string(local_750,"name",&local_2747);
  local_730._0_8_ = &PTR__ParserRefImpl_001e2970;
  local_730._8_4_ = Optional;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_828._0_8_ = &__a2;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e19d0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001e1a20;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  local_828._8_8_ = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9801:34)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9801:34)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9801:34)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9801:34)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_828);
  local_920 = (undefined1  [8])0x0;
  a_Stack_918[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_730._16_8_ = p_Var1 + 1;
  local_730._24_8_ = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_918);
  std::__cxx11::string::string((string *)(local_730 + 0x20),local_750);
  local_6f0._M_p = (pointer)&local_6e0;
  local_6e8 = 0;
  local_6e0._M_local_buf[0] = '\0';
  local_730._0_8_ = &PTR__Opt_001e2880;
  local_6d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_770,"-r",&local_2748);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_6d0,&local_770);
  std::__cxx11::string::string((string *)&local_790,"--reporter",&local_2749);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_6d0,&local_790);
  std::__cxx11::string::string(local_7b0,"reporter to use (defaults to console)",&local_274a);
  std::__cxx11::string::_M_assign((string *)&local_6f0);
  clara::detail::Parser::operator|(&local_2400,&local_2460,(Opt *)local_730);
  std::__cxx11::string::string((string *)&local_848,"name",&local_274b);
  clara::detail::Opt::Opt<std::__cxx11::string>((Opt *)local_828,&config->name,&local_848);
  std::__cxx11::string::string((string *)&local_868,"-n",&local_274c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_7c8,&local_868);
  std::__cxx11::string::string((string *)&local_888,"--name",&local_274d);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_7c8,&local_888);
  std::__cxx11::string::string(local_8a8,"suite name",&local_274e);
  std::__cxx11::string::_M_assign(local_7e8);
  clara::detail::Parser::operator|(&local_23a0,&local_2400,(Opt *)local_828);
  local_2730 = __return_storage_ptr__;
  p_Var2 = (pointer)operator_new(0x20);
  ___a2 = (undefined **)&__a2_1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001e1a70;
  (p_Var2->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__BoundRef_001e1ac0;
  *(ConfigData **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = config;
  local_9f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9844:20)>,_std::allocator<Catch::clara::detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9844:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9844:20)>,_std::allocator<Catch::clara::detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9844:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2);
  local_af0 = (undefined1  [8])0x0;
  _Stack_ae8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ___a2 = (undefined **)&p_Var2->_M_impl;
  local_9f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
  clara::detail::ParserRefImpl<Catch::clara::detail::Opt>::ParserRefImpl
            ((ParserRefImpl<Catch::clara::detail::Opt> *)local_920,
             (shared_ptr<Catch::clara::detail::BoundRef> *)&__a2);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_9f0);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_ae8);
  local_920 = (undefined1  [8])&PTR__Opt_001e2880;
  local_8c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_8c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8c0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_940,"-a",&local_274f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_8c0,&local_940);
  std::__cxx11::string::string((string *)&local_960,"--abort",&local_2750);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_8c0,&local_960);
  std::__cxx11::string::string(local_980,"abort at first failure",&local_2751);
  std::__cxx11::string::_M_assign(local_8e0);
  clara::detail::Parser::operator|(&local_2340,&local_23a0,(Opt *)local_920);
  std::__cxx11::string::string(local_a18,"no. failures",&local_2752);
  ___a2 = &PTR__ParserRefImpl_001e2970;
  local_9f0._M_pi = local_9f0._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_af0 = (undefined1  [8])&__a2_2;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e1b10;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001e1b60;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  _Stack_ae8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9847:20)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9847:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9847:20)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9847:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_af0);
  ___a2_1 = (_func_int **)0x0;
  _Stack_be0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_9e8 = p_Var1 + 1;
  local_9e0._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_be0);
  std::__cxx11::string::string(local_9d8,local_a18);
  local_9b8._M_p = (pointer)&local_9a8;
  local_9b0 = 0;
  local_9a8._M_local_buf[0] = '\0';
  ___a2 = &PTR__Opt_001e2880;
  local_998.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_998.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_998.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_a38,"-x",&local_2753);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_998,&local_a38);
  std::__cxx11::string::string((string *)&local_a58,"--abortx",&local_2754);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_998,&local_a58);
  std::__cxx11::string::string(local_a78,"abort after x failures",&local_2755);
  std::__cxx11::string::_M_assign((string *)&local_9b8);
  clara::detail::Parser::operator|(&local_22e0,&local_2340,(Opt *)&__a2);
  std::__cxx11::string::string(local_b10,"warning name",&local_2756);
  local_af0 = (undefined1  [8])&PTR__ParserRefImpl_001e2970;
  _Stack_ae8._M_pi = _Stack_ae8._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_1 = (undefined **)&__a2_3;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e1bb0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001e1c00;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  _Stack_be0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9708:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9708:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9708:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9708:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_1);
  ___a2_2 = (_func_int **)0x0;
  a_Stack_cd8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_ae0 = p_Var1 + 1;
  local_ad8._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_cd8);
  std::__cxx11::string::string(local_ad0,local_b10);
  local_ab0._M_p = (pointer)&local_aa0;
  local_aa8 = 0;
  local_aa0._M_local_buf[0] = '\0';
  local_af0 = (undefined1  [8])&PTR__Opt_001e2880;
  local_a90.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a90.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a90.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_b30,"-w",&local_2757);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_a90,&local_b30);
  std::__cxx11::string::string((string *)&local_b50,"--warn",&local_2758);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_a90,&local_b50);
  std::__cxx11::string::string(local_b70,"enable warnings",&local_2759);
  std::__cxx11::string::_M_assign((string *)&local_ab0);
  clara::detail::Parser::operator|(&local_2280,&local_22e0,(Opt *)local_af0);
  std::__cxx11::string::string(local_c08,"yes|no",&local_275a);
  ___a2_1 = &PTR__ParserRefImpl_001e2970;
  _Stack_be0._M_pi = _Stack_be0._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_2 = (_func_int **)&__a2_4;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e1c50;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001e1ca0;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  a_Stack_cd8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9853:20)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9853:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9853:20)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9853:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_2);
  ___a2_3 = (_func_int **)0x0;
  _Stack_dd0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_bd8 = p_Var1 + 1;
  local_bd0._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_dd0);
  std::__cxx11::string::string(local_bc8,local_c08);
  local_ba8._M_p = (pointer)&local_b98;
  local_ba0 = 0;
  local_b98._M_local_buf[0] = '\0';
  ___a2_1 = &PTR__Opt_001e2880;
  local_b88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_c28,"-d",&local_275b);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_b88,&local_c28);
  std::__cxx11::string::string((string *)&local_c48,"--durations",&local_275c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_b88,&local_c48);
  std::__cxx11::string::string(local_c68,"show test durations",&local_275d);
  std::__cxx11::string::_M_assign((string *)&local_ba8);
  clara::detail::Parser::operator|(&local_2220,&local_2280,(Opt *)&__a2_1);
  std::__cxx11::string::string((string *)&local_d00,"seconds",&local_275e);
  clara::detail::Opt::Opt<double>((Opt *)&__a2_2,&config->minDuration,&local_d00);
  std::__cxx11::string::string((string *)&local_d20,"-D",&local_275f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c80,&local_d20);
  std::__cxx11::string::string((string *)&local_d40,"--min-duration",&local_2760);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_c80,&local_d40);
  std::__cxx11::string::string
            (local_d60,"show test durations for tests taking at least the given number of seconds",
             &local_2761);
  std::__cxx11::string::_M_assign(local_ca0);
  clara::detail::Parser::operator|(&local_21c0,&local_2220,(Opt *)&__a2_2);
  std::__cxx11::string::string(local_df8,"filename",&local_2762);
  ___a2_3 = &PTR__ParserRefImpl_001e2970;
  _Stack_dd0._M_pi = _Stack_dd0._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_4 = (_func_int **)&__a2_5;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e1cf0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001e1d40;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9724:44)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9724:44)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9724:44)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9724:44)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_4);
  local_fa8 = (undefined1  [8])0x0;
  a_Stack_fa0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_dc8 = p_Var1 + 1;
  local_dc0._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_fa0);
  std::__cxx11::string::string(local_db8,local_df8);
  local_d98._M_p = (pointer)&local_d88;
  local_d90 = 0;
  local_d88._M_local_buf[0] = '\0';
  ___a2_3 = &PTR__Opt_001e2880;
  local_d78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_e18,"-f",&local_2763);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_d78,&local_e18);
  std::__cxx11::string::string((string *)&local_e38,"--input-file",&local_2764);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_d78,&local_e38);
  std::__cxx11::string::string(local_e58,"load test names to run from a file",&local_2765);
  std::__cxx11::string::_M_assign((string *)&local_d98);
  clara::detail::Parser::operator|(&local_2160,&local_21c0,(Opt *)&__a2_3);
  clara::detail::Opt::Opt((Opt *)&__a2_4,&config->filenamesAsTags);
  std::__cxx11::string::string((string *)&local_ef0,"-#",&local_2766);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e70,&local_ef0);
  std::__cxx11::string::string((string *)&local_f10,"--filenames-as-tags",&local_2767);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e70,&local_f10);
  std::__cxx11::string::string(local_f30,"adds a tag for the filename",&local_2768);
  std::__cxx11::string::_M_assign(local_e90);
  clara::detail::Parser::operator|(&local_2100,&local_2160,(Opt *)&__a2_4);
  std::__cxx11::string::string((string *)&local_fc8,"section name",&local_2769);
  clara::detail::Opt::Opt<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Opt *)local_fa8,&config->sectionsToRun,&local_fc8);
  std::__cxx11::string::string((string *)&local_fe8,"-c",&local_276a);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f48,&local_fe8);
  std::__cxx11::string::string((string *)&local_1008,"--section",&local_276b);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f48,&local_1008);
  std::__cxx11::string::string(local_1028,"specify section to run",&local_276c);
  std::__cxx11::string::_M_assign(local_f68);
  clara::detail::Parser::operator|(&local_20a0,&local_2100,(Opt *)local_fa8);
  std::__cxx11::string::string(local_10c0,"quiet|normal|high",&local_276d);
  ___a2_5 = &PTR__ParserRefImpl_001e2970;
  puVar3 = (undefined8 *)operator_new(0x20);
  local_1198._0_8_ = &__a2_6;
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_001e1d90;
  puVar3[2] = &PTR__BoundRef_001e1de0;
  puVar3[3] = config;
  local_1198._8_8_ = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9789:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9789:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9789:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9789:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1198);
  local_1250 = (undefined1  [8])0x0;
  a_Stack_1248[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1248);
  std::__cxx11::string::string(local_1080,local_10c0);
  local_1060._M_p = (pointer)&local_1050;
  local_1058 = 0;
  local_1050._M_local_buf[0] = '\0';
  ___a2_5 = &PTR__Opt_001e2880;
  local_1040.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1040.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1040.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_10e0,"-v",&local_276e);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1040,&local_10e0);
  std::__cxx11::string::string((string *)&local_1100,"--verbosity",&local_276f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1040,&local_1100);
  std::__cxx11::string::string(local_1120,"set output verbosity",&local_2770);
  std::__cxx11::string::_M_assign((string *)&local_1060);
  clara::detail::Parser::operator|(&local_2040,&local_20a0,(Opt *)&__a2_5);
  clara::detail::Opt::Opt((Opt *)local_1198,&config->listTestNamesOnly);
  std::__cxx11::string::string((string *)&local_11b8,"--list-test-names-only",&local_2771);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1138,&local_11b8);
  std::__cxx11::string::string(local_11d8,"list all/matching test cases names only",&local_2772);
  std::__cxx11::string::_M_assign(local_1158);
  clara::detail::Parser::operator|(&local_1fe0,&local_2040,(Opt *)local_1198);
  clara::detail::Opt::Opt((Opt *)local_1250,&config->listReporters);
  std::__cxx11::string::string((string *)&local_1270,"--list-reporters",&local_2773);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_11f0,&local_1270);
  std::__cxx11::string::string(local_1290,"list all reporters",&local_2774);
  std::__cxx11::string::_M_assign(local_1210);
  clara::detail::Parser::operator|(&local_1f80,&local_1fe0,(Opt *)local_1250);
  std::__cxx11::string::string(local_1328,"decl|lex|rand",&local_2775);
  ___a2_6 = &PTR__ParserRefImpl_001e2970;
  puVar3 = (undefined8 *)operator_new(0x20);
  local_13e0 = (undefined1  [8])&__a2_7;
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_001e1e30;
  puVar3[2] = &PTR__BoundRef_001e1e80;
  puVar3[3] = config;
  local_13d8 = (pointer)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9745:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9745:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9745:35)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9745:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_13e0);
  local_14b8 = (undefined1  [8])0x0;
  _Stack_14b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_14b0);
  std::__cxx11::string::string(local_12e8,local_1328);
  local_12c8._M_p = (pointer)&local_12b8;
  local_12c0 = 0;
  local_12b8._M_local_buf[0] = '\0';
  ___a2_6 = &PTR__Opt_001e2880;
  local_12a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_12a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_1348,"--order",&local_2776);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_12a8,&local_1348);
  std::__cxx11::string::string(local_1368,"test case order (defaults to decl)",&local_2777);
  std::__cxx11::string::_M_assign((string *)&local_12c8);
  clara::detail::Parser::operator|(&local_1f20,&local_1f80,(Opt *)&__a2_6);
  std::__cxx11::string::string(local_1400,"\'time\'|number",&local_2778);
  local_13e0 = (undefined1  [8])&PTR__ParserRefImpl_001e2970;
  local_13d8 = (pointer)((ulong)local_13d8 & 0xffffffff00000000);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_14b8 = (undefined1  [8])&__a2_8;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e1ed0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001e1f20;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  _Stack_14b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9756:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9756:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9756:33)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9756:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_14b8);
  ___a2_7 = (_func_int **)0x0;
  a_Stack_1588[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_13d0 = p_Var1 + 1;
  local_13c8._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1588);
  std::__cxx11::string::string(local_13c0,local_1400);
  local_13a0._M_p = (pointer)&local_1390;
  local_1398 = 0;
  local_1390._M_local_buf[0] = '\0';
  local_13e0 = (undefined1  [8])&PTR__Opt_001e2880;
  local_1380.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1380.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1380.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_1420,"--rng-seed",&local_2779);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1380,&local_1420);
  std::__cxx11::string::string(local_1440,"set a specific seed for random numbers",&local_277a);
  std::__cxx11::string::_M_assign((string *)&local_13a0);
  clara::detail::Parser::operator|(&local_1ec0,&local_1f20,(Opt *)local_13e0);
  std::__cxx11::string::string(local_14d8,"yes|no",&local_277b);
  local_14b8 = (undefined1  [8])&PTR__ParserRefImpl_001e2970;
  _Stack_14b0._M_pi = _Stack_14b0._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_7 = (_func_int **)&__a2_9;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e1f70;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001e1fc0;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  a_Stack_1588[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9762:37)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9762:37)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9762:37)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9762:37)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_7);
  ___a2_8 = (_func_int **)0x0;
  _Stack_1640._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14a8 = p_Var1 + 1;
  local_14a0._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1640);
  std::__cxx11::string::string(local_1498,local_14d8);
  local_1478._M_p = (pointer)&local_1468;
  local_1470 = 0;
  local_1468._M_local_buf[0] = '\0';
  local_14b8 = (undefined1  [8])&PTR__Opt_001e2880;
  local_1458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_14f8,"--use-colour",&local_277c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1458,&local_14f8);
  std::__cxx11::string::string(local_1518,"should output be colourised",&local_277d);
  std::__cxx11::string::_M_assign((string *)&local_1478);
  clara::detail::Parser::operator|(&local_1e60,&local_1ec0,(Opt *)local_14b8);
  clara::detail::Opt::Opt((Opt *)&__a2_7,&config->libIdentify);
  std::__cxx11::string::string((string *)&local_15b0,"--libidentify",&local_277e);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1530,&local_15b0);
  std::__cxx11::string::string
            (local_15d0,"report name and version according to libidentify standard",&local_277f);
  std::__cxx11::string::_M_assign(local_1550);
  clara::detail::Parser::operator|(&local_1e00,&local_1e60,(Opt *)&__a2_7);
  std::__cxx11::string::string(local_1668,"never|start|exit|both",&local_2780);
  ___a2_8 = &PTR__ParserRefImpl_001e2970;
  _Stack_1640._M_pi = _Stack_1640._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_9 = (_func_int **)&__a2_10;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e2010;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_001e2060;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  clara::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9775:41)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chrberger[P]stringtoolbox/test/catch.hpp:9775:41)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9775:41)>,_std::allocator<Catch::clara::detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chrberger[P]stringtoolbox_test_catch_hpp:9775:41)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_9);
  local_17f8 = (undefined1  [8])0x0;
  a_Stack_17f0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1638 = p_Var1 + 1;
  local_1630._M_pi = p_Var1;
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_17f0);
  std::__cxx11::string::string(local_1628,local_1668);
  local_1608._M_p = (pointer)&local_15f8;
  local_1600 = 0;
  local_15f8._M_local_buf[0] = '\0';
  ___a2_8 = &PTR__Opt_001e2880;
  local_15e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_15e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_1688,"--wait-for-keypress",&local_2781);
  __return_storage_ptr___00 = local_2730;
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_15e8,&local_1688);
  std::__cxx11::string::string(local_16a8,"waits for a keypress before exiting",&local_2782);
  std::__cxx11::string::_M_assign((string *)&local_1608);
  clara::detail::Parser::operator|(&local_1da0,&local_1e00,(Opt *)&__a2_8);
  std::__cxx11::string::string((string *)&local_1740,"samples",&local_2783);
  clara::detail::Opt::Opt<unsigned_int>((Opt *)&__a2_9,&config->benchmarkSamples,&local_1740);
  std::__cxx11::string::string((string *)&local_1760,"--benchmark-samples",&local_2784);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_16c0,&local_1760);
  std::__cxx11::string::string(local_1780,"number of samples to collect (default: 100)",&local_2785)
  ;
  std::__cxx11::string::_M_assign(local_16e0);
  clara::detail::Parser::operator|(&local_1d40,&local_1da0,(Opt *)&__a2_9);
  std::__cxx11::string::string((string *)&local_1818,"resamples",&local_2786);
  clara::detail::Opt::Opt<unsigned_int>((Opt *)local_17f8,&config->benchmarkResamples,&local_1818);
  std::__cxx11::string::string((string *)&local_1838,"--benchmark-resamples",&local_2787);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1798,&local_1838);
  std::__cxx11::string::string
            (local_1858,"number of resamples for the bootstrap (default: 100000)",&local_2788);
  std::__cxx11::string::_M_assign(local_17b8);
  clara::detail::Parser::operator|(&local_1ce0,&local_1d40,(Opt *)local_17f8);
  std::__cxx11::string::string((string *)&local_18f0,"confidence interval",&local_2789);
  clara::detail::Opt::Opt<double>((Opt *)&__a2_10,&config->benchmarkConfidenceInterval,&local_18f0);
  std::__cxx11::string::string((string *)&local_1910,"--benchmark-confidence-interval",&local_278a);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1870,&local_1910);
  std::__cxx11::string::string
            (local_1930,"confidence interval for the bootstrap (between 0 and 1, default: 0.95)",
             &local_278b);
  std::__cxx11::string::_M_assign(local_1890);
  clara::detail::Parser::operator|(&local_1c80,&local_1ce0,(Opt *)&__a2_10);
  clara::detail::Opt::Opt((Opt *)local_19a8,&config->benchmarkNoAnalysis);
  std::__cxx11::string::string((string *)&local_19c8,"--benchmark-no-analysis",&local_278c);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1948,&local_19c8);
  std::__cxx11::string::string
            (local_19e8,"perform only measurements; do not perform any analysis",&local_278d);
  std::__cxx11::string::_M_assign((string *)(local_19a8 + 0x40));
  clara::detail::Parser::operator|(&local_1c20,&local_1c80,(Opt *)local_19a8);
  std::__cxx11::string::string((string *)&local_1a80,"benchmarkWarmupTime",&local_278e);
  clara::detail::Opt::Opt<long>((Opt *)local_1a60,&config->benchmarkWarmupTime,&local_1a80);
  std::__cxx11::string::string((string *)&local_1aa0,"--benchmark-warmup-time",&local_278f);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a00,&local_1aa0);
  std::__cxx11::string::string
            (local_1ac0,
             "amount of time in milliseconds spent on warming up each test (default: 100)",
             &local_2790);
  std::__cxx11::string::_M_assign((string *)(local_1a60 + 0x40));
  clara::detail::Parser::operator|(&local_1bc0,&local_1c20,(Opt *)local_1a60);
  std::__cxx11::string::string((string *)&local_1b40,"test name|pattern|tags",&local_2791);
  clara::detail::Arg::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::char_traits<char>>>>
            ((Arg *)local_1b20,&config->testsOrTags,&local_1b40);
  std::__cxx11::string::string(local_1b60,"which test or tests to use",&local_2792);
  std::__cxx11::string::_M_assign((string *)(local_1b20 + 0x40));
  clara::detail::Parser::operator|(__return_storage_ptr___00,&local_1bc0,(Arg *)local_1b20);
  std::__cxx11::string::~string(local_1b60);
  clara::detail::ParserRefImpl<Catch::clara::detail::Arg>::~ParserRefImpl
            ((ParserRefImpl<Catch::clara::detail::Arg> *)local_1b20);
  std::__cxx11::string::~string((string *)&local_1b40);
  clara::detail::Parser::~Parser(&local_1bc0);
  std::__cxx11::string::~string(local_1ac0);
  std::__cxx11::string::~string((string *)&local_1aa0);
  clara::detail::Opt::~Opt((Opt *)local_1a60);
  std::__cxx11::string::~string((string *)&local_1a80);
  clara::detail::Parser::~Parser(&local_1c20);
  std::__cxx11::string::~string(local_19e8);
  std::__cxx11::string::~string((string *)&local_19c8);
  clara::detail::Opt::~Opt((Opt *)local_19a8);
  clara::detail::Parser::~Parser(&local_1c80);
  std::__cxx11::string::~string(local_1930);
  std::__cxx11::string::~string((string *)&local_1910);
  clara::detail::Opt::~Opt((Opt *)&__a2_10);
  std::__cxx11::string::~string((string *)&local_18f0);
  clara::detail::Parser::~Parser(&local_1ce0);
  std::__cxx11::string::~string(local_1858);
  std::__cxx11::string::~string((string *)&local_1838);
  clara::detail::Opt::~Opt((Opt *)local_17f8);
  std::__cxx11::string::~string((string *)&local_1818);
  clara::detail::Parser::~Parser(&local_1d40);
  std::__cxx11::string::~string(local_1780);
  std::__cxx11::string::~string((string *)&local_1760);
  clara::detail::Opt::~Opt((Opt *)&__a2_9);
  std::__cxx11::string::~string((string *)&local_1740);
  clara::detail::Parser::~Parser(&local_1da0);
  std::__cxx11::string::~string(local_16a8);
  std::__cxx11::string::~string((string *)&local_1688);
  clara::detail::Opt::~Opt((Opt *)&__a2_8);
  std::__cxx11::string::~string(local_1668);
  clara::detail::Parser::~Parser(&local_1e00);
  std::__cxx11::string::~string(local_15d0);
  std::__cxx11::string::~string((string *)&local_15b0);
  clara::detail::Opt::~Opt((Opt *)&__a2_7);
  clara::detail::Parser::~Parser(&local_1e60);
  std::__cxx11::string::~string(local_1518);
  std::__cxx11::string::~string((string *)&local_14f8);
  clara::detail::Opt::~Opt((Opt *)local_14b8);
  std::__cxx11::string::~string(local_14d8);
  clara::detail::Parser::~Parser(&local_1ec0);
  std::__cxx11::string::~string(local_1440);
  std::__cxx11::string::~string((string *)&local_1420);
  clara::detail::Opt::~Opt((Opt *)local_13e0);
  std::__cxx11::string::~string(local_1400);
  clara::detail::Parser::~Parser(&local_1f20);
  std::__cxx11::string::~string(local_1368);
  std::__cxx11::string::~string((string *)&local_1348);
  clara::detail::Opt::~Opt((Opt *)&__a2_6);
  std::__cxx11::string::~string(local_1328);
  clara::detail::Parser::~Parser(&local_1f80);
  std::__cxx11::string::~string(local_1290);
  std::__cxx11::string::~string((string *)&local_1270);
  clara::detail::Opt::~Opt((Opt *)local_1250);
  clara::detail::Parser::~Parser(&local_1fe0);
  std::__cxx11::string::~string(local_11d8);
  std::__cxx11::string::~string((string *)&local_11b8);
  clara::detail::Opt::~Opt((Opt *)local_1198);
  clara::detail::Parser::~Parser(&local_2040);
  std::__cxx11::string::~string(local_1120);
  std::__cxx11::string::~string((string *)&local_1100);
  std::__cxx11::string::~string((string *)&local_10e0);
  clara::detail::Opt::~Opt((Opt *)&__a2_5);
  std::__cxx11::string::~string(local_10c0);
  clara::detail::Parser::~Parser(&local_20a0);
  std::__cxx11::string::~string(local_1028);
  std::__cxx11::string::~string((string *)&local_1008);
  std::__cxx11::string::~string((string *)&local_fe8);
  clara::detail::Opt::~Opt((Opt *)local_fa8);
  std::__cxx11::string::~string((string *)&local_fc8);
  clara::detail::Parser::~Parser(&local_2100);
  std::__cxx11::string::~string(local_f30);
  std::__cxx11::string::~string((string *)&local_f10);
  std::__cxx11::string::~string((string *)&local_ef0);
  clara::detail::Opt::~Opt((Opt *)&__a2_4);
  clara::detail::Parser::~Parser(&local_2160);
  std::__cxx11::string::~string(local_e58);
  std::__cxx11::string::~string((string *)&local_e38);
  std::__cxx11::string::~string((string *)&local_e18);
  clara::detail::Opt::~Opt((Opt *)&__a2_3);
  std::__cxx11::string::~string(local_df8);
  clara::detail::Parser::~Parser(&local_21c0);
  std::__cxx11::string::~string(local_d60);
  std::__cxx11::string::~string((string *)&local_d40);
  std::__cxx11::string::~string((string *)&local_d20);
  clara::detail::Opt::~Opt((Opt *)&__a2_2);
  std::__cxx11::string::~string((string *)&local_d00);
  clara::detail::Parser::~Parser(&local_2220);
  std::__cxx11::string::~string(local_c68);
  std::__cxx11::string::~string((string *)&local_c48);
  std::__cxx11::string::~string((string *)&local_c28);
  clara::detail::Opt::~Opt((Opt *)&__a2_1);
  std::__cxx11::string::~string(local_c08);
  clara::detail::Parser::~Parser(&local_2280);
  std::__cxx11::string::~string(local_b70);
  std::__cxx11::string::~string((string *)&local_b50);
  std::__cxx11::string::~string((string *)&local_b30);
  clara::detail::Opt::~Opt((Opt *)local_af0);
  std::__cxx11::string::~string(local_b10);
  clara::detail::Parser::~Parser(&local_22e0);
  std::__cxx11::string::~string(local_a78);
  std::__cxx11::string::~string((string *)&local_a58);
  std::__cxx11::string::~string((string *)&local_a38);
  clara::detail::Opt::~Opt((Opt *)&__a2);
  std::__cxx11::string::~string(local_a18);
  clara::detail::Parser::~Parser(&local_2340);
  std::__cxx11::string::~string(local_980);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_940);
  clara::detail::Opt::~Opt((Opt *)local_920);
  clara::detail::Parser::~Parser(&local_23a0);
  std::__cxx11::string::~string(local_8a8);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_868);
  clara::detail::Opt::~Opt((Opt *)local_828);
  std::__cxx11::string::~string((string *)&local_848);
  clara::detail::Parser::~Parser(&local_2400);
  std::__cxx11::string::~string(local_7b0);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_770);
  clara::detail::Opt::~Opt((Opt *)local_730);
  std::__cxx11::string::~string(local_750);
  clara::detail::Parser::~Parser(&local_2460);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_678);
  clara::detail::Opt::~Opt((Opt *)local_638);
  std::__cxx11::string::~string((string *)&local_658);
  clara::detail::Parser::~Parser(&local_24c0);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_580);
  clara::detail::Opt::~Opt((Opt *)local_560);
  clara::detail::Parser::~Parser(&local_2520);
  std::__cxx11::string::~string(local_4e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4a8);
  clara::detail::Opt::~Opt((Opt *)local_488);
  clara::detail::Parser::~Parser(&local_2580);
  std::__cxx11::string::~string(local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  clara::detail::Opt::~Opt((Opt *)local_3b0);
  clara::detail::Parser::~Parser(&local_25e0);
  std::__cxx11::string::~string(local_338);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  clara::detail::Opt::~Opt((Opt *)local_2d8);
  clara::detail::Parser::~Parser(&local_2640);
  std::__cxx11::string::~string(local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  clara::detail::Opt::~Opt((Opt *)local_200);
  clara::detail::Parser::~Parser(&local_26a0);
  std::__cxx11::string::~string(local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  clara::detail::Opt::~Opt((Opt *)local_128);
  clara::detail::Parser::~Parser(&local_2700);
  clara::detail::Opt::~Opt(&local_b0);
  clara::detail::ExeName::~ExeName(&local_2728);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr___00;
  }
  __stack_chk_fail();
}

Assistant:

clara::Parser makeCommandLineParser( ConfigData& config ) {

        using namespace clara;

        auto const setWarning = [&]( std::string const& warning ) {
                auto warningSet = [&]() {
                    if( warning == "NoAssertions" )
                        return WarnAbout::NoAssertions;

                    if ( warning == "NoTests" )
                        return WarnAbout::NoTests;

                    return WarnAbout::Nothing;
                }();

                if (warningSet == WarnAbout::Nothing)
                    return ParserResult::runtimeError( "Unrecognised warning: '" + warning + "'" );
                config.warnings = static_cast<WarnAbout::What>( config.warnings | warningSet );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const loadTestNamesFromFile = [&]( std::string const& filename ) {
                std::ifstream f( filename.c_str() );
                if( !f.is_open() )
                    return ParserResult::runtimeError( "Unable to load input file: '" + filename + "'" );

                std::string line;
                while( std::getline( f, line ) ) {
                    line = trim(line);
                    if( !line.empty() && !startsWith( line, '#' ) ) {
                        if( !startsWith( line, '"' ) )
                            line = '"' + line + '"';
                        config.testsOrTags.push_back( line );
                        config.testsOrTags.emplace_back( "," );
                    }
                }
                //Remove comma in the end
                if(!config.testsOrTags.empty())
                    config.testsOrTags.erase( config.testsOrTags.end()-1 );

                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setTestOrder = [&]( std::string const& order ) {
                if( startsWith( "declared", order ) )
                    config.runOrder = RunTests::InDeclarationOrder;
                else if( startsWith( "lexical", order ) )
                    config.runOrder = RunTests::InLexicographicalOrder;
                else if( startsWith( "random", order ) )
                    config.runOrder = RunTests::InRandomOrder;
                else
                    return clara::ParserResult::runtimeError( "Unrecognised ordering: '" + order + "'" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setRngSeed = [&]( std::string const& seed ) {
                if( seed != "time" )
                    return clara::detail::convertInto( seed, config.rngSeed );
                config.rngSeed = static_cast<unsigned int>( std::time(nullptr) );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setColourUsage = [&]( std::string const& useColour ) {
                    auto mode = toLower( useColour );

                    if( mode == "yes" )
                        config.useColour = UseColour::Yes;
                    else if( mode == "no" )
                        config.useColour = UseColour::No;
                    else if( mode == "auto" )
                        config.useColour = UseColour::Auto;
                    else
                        return ParserResult::runtimeError( "colour mode must be one of: auto, yes or no. '" + useColour + "' not recognised" );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setWaitForKeypress = [&]( std::string const& keypress ) {
                auto keypressLc = toLower( keypress );
                if (keypressLc == "never")
                    config.waitForKeypress = WaitForKeypress::Never;
                else if( keypressLc == "start" )
                    config.waitForKeypress = WaitForKeypress::BeforeStart;
                else if( keypressLc == "exit" )
                    config.waitForKeypress = WaitForKeypress::BeforeExit;
                else if( keypressLc == "both" )
                    config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
                else
                    return ParserResult::runtimeError( "keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised" );
            return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setVerbosity = [&]( std::string const& verbosity ) {
            auto lcVerbosity = toLower( verbosity );
            if( lcVerbosity == "quiet" )
                config.verbosity = Verbosity::Quiet;
            else if( lcVerbosity == "normal" )
                config.verbosity = Verbosity::Normal;
            else if( lcVerbosity == "high" )
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError( "Unrecognised verbosity, '" + verbosity + "'" );
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setReporter = [&]( std::string const& reporter ) {
            IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();

            auto lcReporter = toLower( reporter );
            auto result = factories.find( lcReporter );

            if( factories.end() != result )
                config.reporterName = lcReporter;
            else
                return ParserResult::runtimeError( "Unrecognized reporter, '" + reporter + "'. Check available with --list-reporters" );
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto cli
            = ExeName( config.processName )
            | Help( config.showHelp )
            | Opt( config.listTests )
                ["-l"]["--list-tests"]
                ( "list all/matching test cases" )
            | Opt( config.listTags )
                ["-t"]["--list-tags"]
                ( "list all/matching tags" )
            | Opt( config.showSuccessfulTests )
                ["-s"]["--success"]
                ( "include successful tests in output" )
            | Opt( config.shouldDebugBreak )
                ["-b"]["--break"]
                ( "break into debugger on failure" )
            | Opt( config.noThrow )
                ["-e"]["--nothrow"]
                ( "skip exception tests" )
            | Opt( config.showInvisibles )
                ["-i"]["--invisibles"]
                ( "show invisibles (tabs, newlines)" )
            | Opt( config.outputFilename, "filename" )
                ["-o"]["--out"]
                ( "output filename" )
            | Opt( setReporter, "name" )
                ["-r"]["--reporter"]
                ( "reporter to use (defaults to console)" )
            | Opt( config.name, "name" )
                ["-n"]["--name"]
                ( "suite name" )
            | Opt( [&]( bool ){ config.abortAfter = 1; } )
                ["-a"]["--abort"]
                ( "abort at first failure" )
            | Opt( [&]( int x ){ config.abortAfter = x; }, "no. failures" )
                ["-x"]["--abortx"]
                ( "abort after x failures" )
            | Opt( setWarning, "warning name" )
                ["-w"]["--warn"]
                ( "enable warnings" )
            | Opt( [&]( bool flag ) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no" )
                ["-d"]["--durations"]
                ( "show test durations" )
            | Opt( config.minDuration, "seconds" )
                ["-D"]["--min-duration"]
                ( "show test durations for tests taking at least the given number of seconds" )
            | Opt( loadTestNamesFromFile, "filename" )
                ["-f"]["--input-file"]
                ( "load test names to run from a file" )
            | Opt( config.filenamesAsTags )
                ["-#"]["--filenames-as-tags"]
                ( "adds a tag for the filename" )
            | Opt( config.sectionsToRun, "section name" )
                ["-c"]["--section"]
                ( "specify section to run" )
            | Opt( setVerbosity, "quiet|normal|high" )
                ["-v"]["--verbosity"]
                ( "set output verbosity" )
            | Opt( config.listTestNamesOnly )
                ["--list-test-names-only"]
                ( "list all/matching test cases names only" )
            | Opt( config.listReporters )
                ["--list-reporters"]
                ( "list all reporters" )
            | Opt( setTestOrder, "decl|lex|rand" )
                ["--order"]
                ( "test case order (defaults to decl)" )
            | Opt( setRngSeed, "'time'|number" )
                ["--rng-seed"]
                ( "set a specific seed for random numbers" )
            | Opt( setColourUsage, "yes|no" )
                ["--use-colour"]
                ( "should output be colourised" )
            | Opt( config.libIdentify )
                ["--libidentify"]
                ( "report name and version according to libidentify standard" )
            | Opt( setWaitForKeypress, "never|start|exit|both" )
                ["--wait-for-keypress"]
                ( "waits for a keypress before exiting" )
            | Opt( config.benchmarkSamples, "samples" )
                ["--benchmark-samples"]
                ( "number of samples to collect (default: 100)" )
            | Opt( config.benchmarkResamples, "resamples" )
                ["--benchmark-resamples"]
                ( "number of resamples for the bootstrap (default: 100000)" )
            | Opt( config.benchmarkConfidenceInterval, "confidence interval" )
                ["--benchmark-confidence-interval"]
                ( "confidence interval for the bootstrap (between 0 and 1, default: 0.95)" )
            | Opt( config.benchmarkNoAnalysis )
                ["--benchmark-no-analysis"]
                ( "perform only measurements; do not perform any analysis" )
            | Opt( config.benchmarkWarmupTime, "benchmarkWarmupTime" )
                ["--benchmark-warmup-time"]
                ( "amount of time in milliseconds spent on warming up each test (default: 100)" )
            | Arg( config.testsOrTags, "test name|pattern|tags" )
                ( "which test or tests to use" );

        return cli;
    }